

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
PyreNet::Layer::calculate
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Layer *this,
          vector<double,_std::allocator<double>_> *input)

{
  bool bVar1;
  size_type sVar2;
  double local_b0;
  reference local_a8;
  Perceptron *p_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> *__range1_1;
  undefined1 local_70 [8];
  LayerQueueJob job;
  Perceptron *p;
  iterator __end1;
  iterator __begin1;
  vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> *__range1;
  LayerThreadPool *pLStack_28;
  int track;
  LayerThreadPool *layerThreadPool;
  vector<double,_std::allocator<double>_> *input_local;
  Layer *this_local;
  vector<double,_std::allocator<double>_> *ans;
  
  layerThreadPool = (LayerThreadPool *)input;
  input_local = (vector<double,_std::allocator<double>_> *)this;
  this_local = (Layer *)__return_storage_ptr__;
  pLStack_28 = LayerThreadPool::getInstance();
  sVar2 = std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::size(&this->nodes)
  ;
  __range1._4_4_ = (undefined4)sVar2;
  __end1 = std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::begin
                     (&this->nodes);
  p = (Perceptron *)
      std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::end(&this->nodes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
                                     *)&p), bVar1) {
    job.track = (int *)__gnu_cxx::
                       __normal_iterator<PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
                       ::operator*(&__end1);
    LayerThreadPool::LayerQueueJob::LayerQueueJob
              ((LayerQueueJob *)local_70,(vector<double,_std::allocator<double>_> *)layerThreadPool,
               (Perceptron *)job.track,this->activation,(int *)((long)&__range1 + 4));
    LayerThreadPool::addJob(pLStack_28,(LayerQueueJob *)local_70);
    __gnu_cxx::
    __normal_iterator<PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
    ::operator++(&__end1);
  }
  LayerThreadPool::waitForTasks(pLStack_28,(int *)((long)&__range1 + 4));
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  sVar2 = std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::size(&this->nodes)
  ;
  std::vector<double,_std::allocator<double>_>::reserve(__return_storage_ptr__,sVar2);
  __end1_1 = std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::begin
                       (&this->nodes);
  p_1 = (Perceptron *)
        std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::end(&this->nodes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
                             *)&p_1), bVar1) {
    local_a8 = __gnu_cxx::
               __normal_iterator<PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
               ::operator*(&__end1_1);
    local_b0 = Perceptron::getValue(local_a8);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_b0);
    __gnu_cxx::
    __normal_iterator<PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
    ::operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Layer::calculate(const std::vector<double> &input) {
        LayerThreadPool* layerThreadPool = LayerThreadPool::getInstance();
        int track = this->nodes.size();
        for (Perceptron &p : this->nodes) {
            LayerThreadPool::LayerQueueJob job(input, p, this->activation, track);
            layerThreadPool->addJob(job);
        }
        layerThreadPool->waitForTasks(track);
        std::vector<double> ans;
        ans.reserve(this->nodes.size());
        for (const Perceptron &p : this->nodes) {
            ans.push_back(p.getValue());
        }
        return ans;
    }